

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::placeInstructions
          (InvocationInterlockPlacementPass *this,BasicBlock *block)

{
  bool modified;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  modified = false;
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = ::operator_new(0x18);
  *(InvocationInterlockPlacementPass **)local_40._M_unused._0_8_ = this;
  *(BasicBlock **)((long)local_40._M_unused._0_8_ + 8) = block;
  *(bool **)((long)local_40._M_unused._0_8_ + 0x10) = &modified;
  local_28 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:386:32)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:386:32)>
             ::_M_manager;
  BasicBlock::ForEachSuccessorLabel(block,(function<void_(unsigned_int)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return modified;
}

Assistant:

bool InvocationInterlockPlacementPass::placeInstructions(BasicBlock* block) {
  bool modified = false;

  block->ForEachSuccessorLabel([this, block, &modified](uint32_t succ_id) {
    modified |= placeInstructionsForEdge(
        block, succ_id, after_begin_, predecessors_after_begin_,
        spv::Op::OpBeginInvocationInterlockEXT, /* reverse_cfg= */ true);
    modified |= placeInstructionsForEdge(cfg()->block(succ_id), block->id(),
                                         before_end_, successors_before_end_,
                                         spv::Op::OpEndInvocationInterlockEXT,
                                         /* reverse_cfg= */ false);
  });

  return modified;
}